

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool P_TalkFacing(AActor *player)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  FTranslatedLineTarget *in_RCX;
  undefined8 local_68;
  undefined1 local_60 [16];
  FTranslatedLineTarget t;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    bVar3 = (byte)in_RCX;
    if (lVar2 == 0x18) goto LAB_0041ad90;
    local_60._0_8_ =
         *(double *)((long)P_TalkFacing::angleofs + lVar2) + (player->Angles).Yaw.Degrees;
    local_68 = 0x4041800000000000;
    in_RCX = &t;
    P_AimLineAttack((AActor *)(local_60 + 8),(DAngle *)player,128.0,
                    (FTranslatedLineTarget *)local_60,(DAngle *)&t,(int)&local_68,(AActor *)0x29,
                    (AActor *)0x0);
    lVar1 = lVar2 + 8;
  } while (t.linetarget == (AActor *)0x0);
  if ((((t.linetarget)->health < 1) || ((((t.linetarget)->flags4).Value & 0x8000) != 0)) ||
     ((t.linetarget)->Conversation == (FStrifeDialogueNode *)0x0)) {
    bVar3 = 0;
  }
  else {
    AActor::ConversationAnimation(t.linetarget,0);
    P_StartConversation(t.linetarget,player,true,true);
    bVar3 = 1;
  }
LAB_0041ad90:
  return (bool)(lVar2 != 0x18 & bVar3);
}

Assistant:

bool P_TalkFacing(AActor *player)
{
	static const double angleofs[] = { 0, 90./16, -90./16 };
	FTranslatedLineTarget t;

	for (double angle : angleofs)
	{
		P_AimLineAttack(player, player->Angles.Yaw + angle, TALKRANGE, &t, 35., ALF_FORCENOSMART | ALF_CHECKCONVERSATION | ALF_PORTALRESTRICT);
		if (t.linetarget != NULL)
		{
			if (t.linetarget->health > 0 && // Dead things can't talk.
				!(t.linetarget->flags4 & MF4_INCOMBAT) && // Fighting things don't talk either.
				t.linetarget->Conversation != NULL)
			{
				// Give the NPC a chance to play a brief animation
				t.linetarget->ConversationAnimation(0);
				P_StartConversation(t.linetarget, player, true, true);
				return true;
			}
			return false;
		}
	}
	return false;
}